

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O1

void leveldb_put(leveldb_t *db,leveldb_writeoptions_t *options,char *key,size_t keylen,char *val,
                size_t vallen,char **errptr)

{
  Status local_38;
  char *local_30;
  size_t local_28;
  char *local_20;
  size_t local_18;
  
  local_30 = val;
  local_28 = vallen;
  local_20 = key;
  local_18 = keylen;
  (*db->rep->_vptr_DB[2])(&local_38,db->rep,options,&local_20,&local_30);
  SaveError(errptr,&local_38);
  if (local_38.state_ != (char *)0x0) {
    operator_delete__(local_38.state_);
  }
  return;
}

Assistant:

void leveldb_put(leveldb_t* db, const leveldb_writeoptions_t* options,
                 const char* key, size_t keylen, const char* val, size_t vallen,
                 char** errptr) {
  SaveError(errptr,
            db->rep->Put(options->rep, Slice(key, keylen), Slice(val, vallen)));
}